

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O3

void __thiscall
sznet::WeakCallback<sznet::net::TcpConnection>::operator()
          (WeakCallback<sznet::net::TcpConnection> *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Atomic_word _Var3;
  bool bVar4;
  element_type *local_20;
  
  this_00 = (this->m_object).super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3 = this_00->_M_use_count;
    do {
      if (_Var3 == 0) {
        return;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = _Var3 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = _Var3 + 1;
        iVar1 = _Var3;
      }
      _Var3 = iVar1;
      UNLOCK();
    } while (!bVar4);
    peVar2 = (this->m_object).
             super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0 && this_00->_M_use_count != 0) {
      local_20 = peVar2;
      if ((this->m_function).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->m_function)._M_invoker)((_Any_data *)&this->m_function,&local_20);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void operator()(ARGS&&... args) const
	{
		// �����Ƿ�����
		std::shared_ptr<CLASS> ptr(m_object.lock());
		if (ptr)
		{
			// û�п����͵��ûص�����
			m_function(ptr.get(), std::forward<ARGS>(args)...);
		}
		// else
		// {
		//   LOG_TRACE << "expired";
		// }
	}